

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,ImS64 *p_scroll_v,
                       ImS64 size_visible_v,ImS64 size_contents_v,ImDrawFlags flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  ImGuiContext *pIVar3;
  ImGuiWindow *pIVar4;
  long *plVar5;
  bool bVar6;
  ushort uVar7;
  ImU32 col;
  ImU32 col_00;
  long lVar8;
  long lVar9;
  ushort uVar10;
  ImGuiCol idx;
  long lVar11;
  uint uVar12;
  float fVar13;
  int iVar14;
  float fVar18;
  int iVar19;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ImRect IVar23;
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined4 in_XMM5_Db;
  float fVar31;
  bool held;
  bool hovered;
  float local_dc;
  ImRect local_d8;
  ImGuiAxis local_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ImGuiWindow *local_a0;
  float local_98;
  float local_88;
  uint uStack_84;
  uint uStack_80;
  undefined4 uStack_7c;
  long *local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar16 [16];
  undefined1 auVar24 [16];
  
  pIVar3 = GImGui;
  local_a0 = GImGui->CurrentWindow;
  if (local_a0->SkipItems == false) {
    fVar13 = (bb_frame->Max).x - (bb_frame->Min).x;
    fVar18 = (bb_frame->Max).y - (bb_frame->Min).y;
    held = false;
    if ((0.0 < fVar13) && (0.0 < fVar18)) {
      local_dc = 1.0;
      if (axis == ImGuiAxis_Y) {
        fVar26 = (GImGui->Style).FramePadding.y;
        fVar26 = fVar26 + fVar26;
        if (fVar18 < fVar26 + GImGui->FontSize) {
          fVar26 = (fVar18 - GImGui->FontSize) / fVar26;
          if (fVar26 < 0.0) {
            return false;
          }
          local_dc = 1.0;
          if (fVar26 <= 1.0) {
            local_dc = fVar26;
          }
          if (local_dc <= 0.0) {
            return false;
          }
        }
      }
      iVar14 = (int)((fVar13 + -2.0) * 0.5);
      iVar19 = (int)((fVar18 + -2.0) * 0.5);
      auVar29._0_4_ = -(uint)(iVar14 < 0);
      auVar29._4_4_ = -(uint)(iVar19 < 0);
      auVar29._8_8_ = 0;
      auVar15._0_4_ = -(uint)(3 < iVar14);
      auVar15._4_4_ = -(uint)(3 < iVar19);
      auVar15._8_8_ = 0;
      auVar30._8_4_ = 0x80000000;
      auVar30._0_8_ = CONCAT44((float)iVar19,(float)iVar14) ^ 0x8000000080000000;
      auVar30._12_4_ = 0x80000000;
      auVar30 = auVar29 & _DAT_001b8670 | ~auVar29 & (auVar15 & _DAT_001c16d0 | ~auVar15 & auVar30);
      fVar18 = auVar30._0_4_;
      fVar26 = auVar30._4_4_;
      auVar21._0_8_ = auVar30._0_8_;
      auVar21._8_4_ = fVar18;
      auVar21._12_4_ = fVar26;
      local_d8.Min.x = (bb_frame->Min).x;
      local_d8.Min.y = (bb_frame->Min).y;
      local_d8.Max.x = (bb_frame->Max).x;
      local_d8.Max.y = (bb_frame->Max).y;
      local_d8.Min.x = local_d8.Min.x - fVar18;
      fVar13 = local_d8.Min.y - fVar26;
      IVar23.Min.y = fVar13;
      IVar23.Min.x = local_d8.Min.x;
      local_d8.Max.x = local_d8.Max.x + fVar18;
      fVar18 = local_d8.Max.y + fVar26;
      auVar2._4_8_ = auVar21._8_8_;
      auVar2._0_4_ = local_d8.Min.y + fVar26;
      auVar22._0_8_ = auVar2._0_8_ << 0x20;
      auVar22._8_4_ = local_d8.Max.x;
      auVar22._12_4_ = fVar18;
      IVar23.Max = auVar22._8_8_;
      fStack_b0 = local_d8.Max.x;
      if (axis != ImGuiAxis_X) {
        fStack_b0 = fVar18;
        local_d8.Min.x = fVar13;
      }
      local_b8 = fStack_b0 - local_d8.Min.x;
      lVar11 = size_contents_v - size_visible_v;
      if (lVar11 == 0 || size_contents_v < size_visible_v) {
        size_contents_v = size_visible_v;
      }
      if (size_contents_v < 2) {
        size_contents_v = 1;
      }
      local_58._4_12_ = IVar23._4_12_;
      local_58._0_4_ = (undefined4)size_visible_v;
      fVar28 = ((float)local_58._0_4_ / (float)size_contents_v) * local_b8;
      fVar26 = (GImGui->Style).GrabMinSize;
      fVar31 = local_b8;
      if (fVar28 <= local_b8) {
        fVar31 = fVar28;
      }
      uVar12 = -(uint)(fVar28 < fVar26);
      uStack_84 = ~(uint)fVar13 & (uint)fVar18;
      uStack_80 = ~(uint)local_d8.Max.x & (uint)fStack_b0;
      local_88 = (float)(uVar12 & (uint)fVar26 | ~uVar12 & (uint)fVar31);
      uStack_7c = 0;
      held = false;
      hovered = false;
      local_d8 = IVar23;
      local_bc = axis;
      fStack_b4 = fVar18;
      fStack_ac = fVar18;
      local_70 = p_scroll_v;
      ItemAdd(bb_frame,id,(ImRect *)0x0,2);
      ButtonBehavior(&local_d8,id,&hovered,&held,0x40000);
      plVar5 = local_70;
      auVar25._4_4_ = fStack_b4;
      auVar25._0_4_ = local_b8;
      auVar17._4_4_ = uStack_84;
      auVar17._0_4_ = local_88;
      if (lVar11 < 2) {
        lVar11 = 1;
      }
      fVar13 = (float)lVar11;
      auVar17._8_4_ = uStack_84;
      auVar17._12_4_ = fVar18;
      auVar16._8_8_ = auVar17._8_8_;
      auVar16._4_4_ = (float)*local_70;
      auVar16._0_4_ = local_88;
      auVar25._8_4_ = fStack_b4;
      auVar25._12_4_ = in_XMM5_Db;
      auVar24._8_8_ = auVar25._8_8_;
      auVar24._4_4_ = fVar13;
      auVar24._0_4_ = local_b8;
      auVar30 = divps(auVar16,auVar24);
      fVar26 = auVar30._0_4_;
      fVar31 = auVar30._4_4_;
      auVar1._4_4_ = -(uint)(fVar26 < 1.0);
      auVar1._0_4_ = -(uint)(fVar26 < 1.0);
      auVar1._8_4_ = -(uint)(fVar31 < 0.0);
      auVar1._12_4_ = -(uint)(fVar31 < 0.0);
      uVar12 = movmskpd(1,auVar1);
      fVar18 = 0.0;
      if (((uVar12 & 2) == 0) && (fVar18 = 1.0, fVar31 <= 1.0)) {
        fVar18 = fVar31;
      }
      fVar31 = local_b8 - local_88;
      fVar18 = (fVar18 * fVar31) / local_b8;
      if (((1.0 <= local_dc) && ((uVar12 & 1) != 0)) && (held != false)) {
        fVar20 = (*(float *)((pIVar3->IO).MouseDown + (long)local_bc * 4 + -8) -
                 (&local_d8.Min.x)[local_bc]) / local_b8;
        fVar28 = 1.0;
        if (fVar20 <= 1.0) {
          fVar28 = fVar20;
        }
        fVar27 = 0.0;
        fVar28 = (float)(~-(uint)(fVar20 < 0.0) & (uint)fVar28);
        uVar10 = 0xffff;
        if (fVar18 <= fVar28) {
          uVar10 = (ushort)(fVar26 + fVar18 < fVar28);
        }
        if (pIVar3->ActiveIdIsJustActivated == false) {
          uVar7 = pIVar3->ScrollbarSeekMode;
        }
        else {
          pIVar3->ScrollbarSeekMode = uVar10;
          if (uVar10 == 0) {
            fVar27 = fVar26 * -0.5 + (fVar28 - fVar18);
          }
          pIVar3->ScrollbarClickDeltaToGrabCenter = fVar27;
          uVar7 = uVar10;
        }
        if (uVar7 == 0) {
          fVar26 = (fVar26 * -0.5 + (fVar28 - pIVar3->ScrollbarClickDeltaToGrabCenter)) /
                   (1.0 - fVar26);
          fVar18 = 1.0;
          if (fVar26 <= 1.0) {
            fVar18 = fVar26;
          }
          lVar8 = (long)((float)(~-(uint)(fVar26 < 0.0) & (uint)fVar18) * fVar13);
          *local_70 = lVar8;
        }
        else {
          fStack_5c = fStack_ac;
          local_98 = fVar13;
          local_68 = fVar31;
          fStack_64 = fStack_b4;
          fStack_60 = fStack_b0;
          bVar6 = IsMouseClicked(0,1,0);
          fVar13 = local_98;
          fVar31 = local_68;
          if (bVar6) {
            lVar8 = *plVar5;
            if (uVar10 == pIVar3->ScrollbarSeekMode) {
              fVar18 = (float)local_58._0_4_;
              if (pIVar3->ScrollbarSeekMode < 1) {
                fVar18 = -(float)local_58._0_4_;
              }
              lVar9 = lVar8 + (long)fVar18;
              if (lVar9 < lVar11) {
                lVar11 = lVar9;
              }
              lVar8 = 0;
              if (-1 < lVar9) {
                lVar8 = lVar11;
              }
              *plVar5 = lVar8;
            }
          }
          else {
            lVar8 = *plVar5;
          }
        }
        fVar13 = (float)lVar8 / fVar13;
        fVar18 = 1.0;
        if (fVar13 <= 1.0) {
          fVar18 = fVar13;
        }
        fVar18 = (fVar31 * (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar18)) / local_b8;
      }
      local_b8 = fVar18;
      pIVar4 = local_a0;
      col = GetColorU32(0xe,1.0);
      idx = 0x11;
      if (held == false) {
        idx = (hovered & 1) + 0xf;
      }
      col_00 = GetColorU32(idx,local_dc);
      ImDrawList::AddRectFilled
                (pIVar4->DrawList,&bb_frame->Min,&bb_frame->Max,col,pIVar4->WindowRounding,flags);
      if (local_bc == ImGuiAxis_X) {
        local_40.x = local_d8.Min.x + (local_d8.Max.x - local_d8.Min.x) * local_b8;
        local_38.x = local_88 + local_40.x;
        local_38.y = local_d8.Max.y;
        local_40.y = local_d8.Min.y;
      }
      else {
        local_40.y = (local_d8.Max.y - local_d8.Min.y) * local_b8 + local_d8.Min.y;
        local_38.y = local_88 + local_40.y;
        local_38.x = local_d8.Max.x;
        local_40.x = local_d8.Min.x;
      }
      ImDrawList::AddRectFilled
                (pIVar4->DrawList,&local_40,&local_38,col_00,(pIVar3->Style).ScrollbarRounding,0);
    }
  }
  else {
    held = false;
  }
  return held;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, ImS64* p_scroll_v, ImS64 size_visible_v, ImS64 size_contents_v, ImDrawFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_TRUNC((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_TRUNC((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_visible_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const ImS64 win_size_v = ImMax(ImMax(size_contents_v, size_visible_v), (ImS64)1);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * ((float)size_visible_v / (float)win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ItemAdd(bb_frame, id, NULL, ImGuiItemFlags_NoNav);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    const ImS64 scroll_max = ImMax((ImS64)1, size_contents_v - size_visible_v);
    float scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        const float scrollbar_pos_v = bb.Min[axis];
        const float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);

        const int held_dir = (clicked_v_norm < grab_v_norm) ? -1 : (clicked_v_norm > grab_v_norm + grab_h_norm) ? +1 : 0;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            g.ScrollbarSeekMode = (short)held_dir;
            g.ScrollbarClickDeltaToGrabCenter = (g.ScrollbarSeekMode == 0.0f) ? clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f : 0.0f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        if (g.ScrollbarSeekMode == 0)
        {
            // Absolute seeking
            const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
            *p_scroll_v = (ImS64)(scroll_v_norm * scroll_max);
        }
        else
        {
            // Page by page
            if (IsMouseClicked(ImGuiMouseButton_Left, ImGuiInputFlags_Repeat) && held_dir == g.ScrollbarSeekMode)
            {
                float page_dir = (g.ScrollbarSeekMode > 0.0f) ? +1.0f : -1.0f;
                *p_scroll_v = ImClamp(*p_scroll_v + (ImS64)(page_dir * size_visible_v), (ImS64)0, scroll_max);
            }
        }

        // Update values for rendering
        scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seek'ed and saturated
        //if (seek_absolute)
        //    g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, flags);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}